

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

WeakDiagStack * __thiscall
Js::ProbeContainer::GetFramePointers(ProbeContainer *this,DWORD_PTR dispatchHaltFrameAddress)

{
  LONG *pLVar1;
  DebugManager *this_00;
  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *pSVar2;
  bool bVar3;
  DiagStackFrame **ppDVar4;
  ReferencedArenaAdapter *pRVar5;
  HeapAllocator *alloc;
  WeakDiagStack *pWVar6;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->framePointers == (DiagStack *)0x0) ||
     (this->debugSessionNumber < this->debugManager->debugSessionNumber)) {
    UpdateFramePointers(this,true,dispatchHaltFrameAddress);
    this_00 = this->debugManager;
    this->debugSessionNumber = this_00->debugSessionNumber;
    if (0 < (this->framePointers->list).
            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.count)
    {
      ppDVar4 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>
                ::Peek(this->framePointers,0);
      bVar3 = DebugManager::IsMatchTopFrameStackAddress(this_00,*ppDVar4);
      if (bVar3) {
        ppDVar4 = JsUtil::
                  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                            (this->framePointers,0);
        DiagStackFrame::SetIsTopFrame(*ppDVar4);
      }
    }
  }
  pRVar5 = DebugManager::GetDiagnosticArena(this->debugManager);
  local_40 = (undefined1  [8])
             &Memory::
              WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3df9874;
  data.filename._0_4_ = 0xc0;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
  pWVar6 = (WeakDiagStack *)new<Memory::HeapAllocator>(0x10,alloc,0x2f6726);
  pSVar2 = this->framePointers;
  pWVar6->adapter = pRVar5;
  pWVar6->p = pSVar2;
  LOCK();
  pLVar1 = &(pRVar5->super_RefCounted).refCount;
  *pLVar1 = *pLVar1 + 1;
  UNLOCK();
  return pWVar6;
}

Assistant:

WeakDiagStack * ProbeContainer::GetFramePointers(DWORD_PTR dispatchHaltFrameAddress)
    {
        if (framePointers == nullptr || this->debugSessionNumber < debugManager->GetDebugSessionNumber())
        {
            UpdateFramePointers(/*fMatchWithCurrentScriptContext*/true, dispatchHaltFrameAddress);
            this->debugSessionNumber = debugManager->GetDebugSessionNumber();

            if ((framePointers->Count() > 0) &&
                debugManager->IsMatchTopFrameStackAddress(framePointers->Peek(0)))
            {
                framePointers->Peek(0)->SetIsTopFrame();
            }
        }

        ReferencedArenaAdapter* pRefArena = debugManager->GetDiagnosticArena();
        return HeapNew(WeakDiagStack,pRefArena,framePointers);
    }